

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

int __thiscall
duckdb_re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  char *pcVar1;
  Inst *this_00;
  int iVar2;
  Thread *t0;
  char **__dest;
  char *pcVar3;
  bool bVar4;
  IndexValue *pIVar5;
  ostream *poVar6;
  uint uVar7;
  IndexValue *pIVar8;
  ostringstream local_1a8 [376];
  
  nextq->size_ = 0;
  pIVar5 = (runq->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
           .
           super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
           ._M_head_impl;
  pcVar1 = p + -1;
  pIVar8 = pIVar5;
  do {
    if (pIVar8 == pIVar5 + runq->size_) {
LAB_00415aac:
      runq->size_ = 0;
      return 0;
    }
    t0 = pIVar8->value_;
    if (t0 != (Thread *)0x0) {
      if (((this->longest_ != true) || (this->matched_ != true)) || (*t0->capture <= *this->match_))
      {
        this_00 = (this->prog_->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                  pIVar8->index_;
        uVar7 = this_00->out_opcode_ & 7;
        if (uVar7 == 1) {
          if ((pIVar8 == pIVar5) &&
             ((bVar4 = Prog::Inst::greedy(this_00,this->prog_), bVar4 || (this->longest_ == true))))
          {
            memmove(this->match_,t0->capture,(long)this->ncapture_ << 3);
            this->matched_ = true;
            iVar2 = (t0->field_0).ref;
            (t0->field_0).ref = iVar2 + -1;
            do {
              pIVar5 = pIVar8;
              if (iVar2 < 2) {
                t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                this->freelist_ = t0;
              }
              do {
                pIVar8 = pIVar5 + 1;
                if (pIVar8 == (runq->dense_).ptr_._M_t.
                              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                              .
                              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                              ._M_head_impl + runq->size_) {
                  runq->size_ = 0;
                  bVar4 = Prog::Inst::greedy(this_00,this->prog_);
                  if (bVar4) {
                    return (this_00->field_1).cap_;
                  }
                  return this_00->out_opcode_ >> 4;
                }
                t0 = pIVar5[1].value_;
                pIVar5 = pIVar8;
              } while (t0 == (Thread *)0x0);
              iVar2 = (t0->field_0).ref;
              (t0->field_0).ref = iVar2 + -1;
            } while( true );
          }
        }
        else if (uVar7 == 2) {
          AddToThreadq(this,nextq,this_00->out_opcode_ >> 4,c,context,p,t0);
        }
        else if (uVar7 == 5) {
          if (p == (char *)0x0) {
            memmove(this->match_,t0->capture,(long)this->ncapture_ << 3);
            this->match_[1] = (char *)0x0;
LAB_00415932:
            this->matched_ = true;
          }
          else if ((this->endmatch_ != true) || (pcVar1 == this->etext_)) {
            if (this->longest_ == false) {
              memmove(this->match_,t0->capture,(long)this->ncapture_ << 3);
              this->match_[1] = pcVar1;
              this->matched_ = true;
              iVar2 = (t0->field_0).ref;
              (t0->field_0).ref = iVar2 + -1;
              do {
                pIVar5 = pIVar8;
                if (iVar2 < 2) {
                  t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
                  this->freelist_ = t0;
                }
                do {
                  pIVar8 = pIVar5 + 1;
                  if (pIVar8 == (runq->dense_).ptr_._M_t.
                                super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                                .
                                super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                                ._M_head_impl + runq->size_) goto LAB_00415aac;
                  t0 = pIVar5[1].value_;
                  pIVar5 = pIVar8;
                } while (t0 == (Thread *)0x0);
                iVar2 = (t0->field_0).ref;
                (t0->field_0).ref = iVar2 + -1;
              } while( true );
            }
            __dest = this->match_;
            if (((this->matched_ != true) || (pcVar3 = *t0->capture, pcVar3 < *__dest)) ||
               ((pcVar3 == *__dest && (__dest[1] < pcVar1)))) {
              memmove(__dest,t0->capture,(long)this->ncapture_ << 3);
              this->match_[1] = pcVar1;
              goto LAB_00415932;
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar6 = std::operator<<((ostream *)local_1a8,"Unhandled ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this_00->out_opcode_ & 7);
          std::operator<<(poVar6," in step");
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
        }
      }
      iVar2 = (t0->field_0).ref;
      (t0->field_0).ref = iVar2 + -1;
      if (iVar2 < 2) {
        t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
        this->freelist_ = t0;
      }
    }
    pIVar8 = pIVar8 + 1;
    pIVar5 = (runq->dense_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
             .
             super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
             ._M_head_impl;
  } while( true );
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior (arithmetic on a null pointer)
        // by storing p instead of p-1. (What would the latter even mean?!)
        // This complements the special case in NFA::Search().
        if (p == NULL) {
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;
          break;
        }

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i) {
            if (i->value() != NULL)
              Decref(i->value());
          }
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}